

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lundump.c
# Opt level: O2

LClosure * luaU_undump(lua_State *L,ZIO *Z,char *name)

{
  char cVar1;
  StkId pSVar2;
  lu_byte lVar3;
  byte bVar4;
  lua_Integer lVar5;
  LClosure *o;
  Proto *f;
  char *why;
  LClosure *x_;
  lua_Number lVar6;
  LoadState local_30;
  
  cVar1 = *name;
  if (cVar1 == '\x1b') {
    name = "binary string";
  }
  else if ((cVar1 == '@') || (cVar1 == '=')) {
    name = name + 1;
  }
  local_30.L = L;
  local_30.Z = Z;
  local_30.name = name;
  checkliteral(&local_30,"Lua","not a binary chunk");
  lVar3 = loadByte(&local_30);
  if (lVar3 == 'T') {
    lVar3 = loadByte(&local_30);
    if (lVar3 == '\0') {
      checkliteral(&local_30,anon_var_dwarf_14ba4,"corrupted chunk");
      fchecksize(&local_30,4,"Instruction");
      fchecksize(&local_30,8,"lua_Integer");
      fchecksize(&local_30,8,"lua_Number");
      lVar5 = loadInteger(&local_30);
      if (lVar5 == 0x5678) {
        lVar6 = loadNumber(&local_30);
        if ((lVar6 == 370.5) && (!NAN(lVar6))) {
          bVar4 = loadByte(&local_30);
          o = luaF_newLclosure(L,(uint)bVar4);
          pSVar2 = (L->top).p;
          *(LClosure **)pSVar2 = o;
          (pSVar2->val).tt_ = 'F';
          luaD_inctop(L);
          f = luaF_newproto(L);
          o->p = f;
          if (((o->marked & 0x20) != 0) && ((f->marked & 0x18) != 0)) {
            luaC_barrier_(L,(GCObject *)o,(GCObject *)f);
            f = o->p;
          }
          loadFunction(&local_30,f,(TString *)0x0);
          return o;
        }
        why = "float format mismatch";
      }
      else {
        why = "integer format mismatch";
      }
    }
    else {
      why = "format mismatch";
    }
  }
  else {
    why = "version mismatch";
  }
  error(&local_30,why);
}

Assistant:

LClosure *luaU_undump(lua_State *L, ZIO *Z, const char *name) {
  LoadState S;
  LClosure *cl;
  if (*name == '@' || *name == '=')
    S.name = name + 1;
  else if (*name == LUA_SIGNATURE[0])
    S.name = "binary string";
  else
    S.name = name;
  S.L = L;
  S.Z = Z;
  checkHeader(&S);
  cl = luaF_newLclosure(L, loadByte(&S));
  setclLvalue2s(L, L->top.p, cl);
  luaD_inctop(L);
  cl->p = luaF_newproto(L);
  luaC_objbarrier(L, cl, cl->p);
  loadFunction(&S, cl->p, NULL);
  lua_assert(cl->nupvalues == cl->p->sizeupvalues);
  luai_verifycode(L, cl->p);
  return cl;
}